

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool parse_number(element_t *element,int id,float *number,_Bool percent,_Bool inherit)

{
  _Bool _Var1;
  string_t *psVar2;
  char *end;
  float fVar3;
  float fVar4;
  char *local_20;
  
  psVar2 = find_attribute(element,id,inherit);
  if (psVar2 == (string_t *)0x0) {
    _Var1 = false;
  }
  else {
    local_20 = psVar2->data;
    end = local_20 + psVar2->length;
    _Var1 = parse_float(&local_20,end,number);
    if (percent && _Var1) {
      if ((local_20 < end) && (*local_20 == '%')) {
        fVar3 = *number / 100.0;
      }
      else {
        fVar3 = *number;
      }
      fVar4 = 0.0;
      if ((0.0 <= fVar3) && (fVar4 = 1.0, fVar3 <= 1.0)) {
        fVar4 = fVar3;
      }
      *number = fVar4;
    }
  }
  return _Var1;
}

Assistant:

static bool parse_number(const element_t* element, int id, float* number, bool percent, bool inherit)
{
    const string_t* value = find_attribute(element, id, inherit);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(!parse_float(&it, end, number))
        return false;
    if(percent) {
        if(skip_delim(&it, end, '%'))
            *number /= 100.f;
        *number = CLAMP(*number, 0.f, 1.f);
    }

    return true;
}